

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int ecdh_sha2_nistp(LIBSSH2_SESSION *session,libssh2_curve_type type,uchar *data,size_t data_len,
                   uchar *public_key,size_t public_key_len,EVP_PKEY *private_key,
                   kmdhgGPshakex_state_t *exchange_state)

{
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var1;
  LIBSSH2_CRYPT_METHOD *pLVar2;
  _LIBSSH2_MAC_METHOD *p_Var3;
  LIBSSH2_COMP_METHOD *pLVar4;
  _func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *p_Var5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  BIGNUM *pBVar15;
  uchar *puVar16;
  uchar *puVar17;
  size_t sVar18;
  LIBSSH2_HOSTKEY_METHOD *pLVar19;
  char *pcVar20;
  ulong uVar21;
  libssh2_curve_type lVar22;
  size_t sVar23;
  uchar *puVar24;
  size_t sVar25;
  uint32_t value;
  EVP_MD_CTX *ctx;
  libssh2_curve_type local_84;
  void **local_80;
  uchar *server_public_key;
  uchar *local_70;
  size_t server_public_key_len;
  uint local_5c;
  EVP_MD_CTX *hash;
  uchar *local_50;
  size_t local_48;
  size_t *local_40;
  uchar **local_38;
  
  if (data_len < 5) {
    iVar7 = _libssh2_error(session,-10,"Host key data is too short");
    return iVar7;
  }
  local_84 = type;
  if (exchange_state->state == libssh2_NB_state_idle) {
    pBVar15 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar15;
    exchange_state->state = libssh2_NB_state_created;
  }
  iVar7 = 0;
  if (exchange_state->state == libssh2_NB_state_created) {
    local_50 = data + 1;
    hash = (EVP_MD_CTX *)data;
    local_48 = data_len;
    iVar7 = _libssh2_copy_string
                      (session,(string_buf *)&hash,&session->server_hostkey,&server_public_key_len);
    if (iVar7 == 0) {
      session->server_hostkey_len = (uint32_t)server_public_key_len;
      iVar7 = _libssh2_sha1_init((EVP_MD_CTX **)&server_public_key);
      if ((iVar7 == 0) ||
         (iVar7 = _libssh2_sha1_update
                            ((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                             (ulong)session->server_hostkey_len), iVar7 == 0)) {
LAB_001103ab:
        iVar8 = 0;
      }
      else {
        iVar7 = _libssh2_sha1_final((EVP_MD_CTX **)&server_public_key,session->server_hostkey_sha1);
        iVar8 = 1;
        if (iVar7 == 0) goto LAB_001103ab;
      }
      session->server_hostkey_sha1_valid = iVar8;
      iVar7 = _libssh2_sha256_init((EVP_MD_CTX **)&server_public_key);
      if ((iVar7 == 0) ||
         (iVar7 = _libssh2_sha256_update
                            ((EVP_MD_CTX **)&server_public_key,session->server_hostkey,
                             (ulong)session->server_hostkey_len), iVar7 == 0)) {
LAB_001103f6:
        iVar8 = 0;
      }
      else {
        iVar7 = _libssh2_sha256_final
                          ((EVP_MD_CTX **)&server_public_key,session->server_hostkey_sha256);
        iVar8 = 1;
        if (iVar7 == 0) goto LAB_001103f6;
      }
      session->server_hostkey_sha256_valid = iVar8;
      iVar7 = (*session->hostkey->init)
                        (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                         &session->server_hostkey_abstract);
      if (iVar7 != 0) {
        pcVar20 = "Unable to initialize hostkey importer ECDH";
LAB_0011042d:
        iVar7 = -10;
        goto LAB_00110462;
      }
      iVar7 = _libssh2_get_string((string_buf *)&hash,&server_public_key,&server_public_key_len);
      if (iVar7 != 0) {
        pcVar20 = "Unexpected key length ECDH";
        iVar7 = -0xe;
        goto LAB_00110462;
      }
      local_80 = &session->server_hostkey_abstract;
      iVar7 = _libssh2_get_string((string_buf *)&hash,&exchange_state->h_sig,
                                  &exchange_state->h_sig_len);
      if (iVar7 != 0) {
        pcVar20 = "Unexpected ECDH server sig length";
        goto LAB_0011042d;
      }
      local_40 = &exchange_state->h_sig_len;
      local_38 = &exchange_state->h_sig;
      iVar7 = _libssh2_ecdh_gen_k(&exchange_state->k,private_key,
                                  (uchar *)CONCAT44(server_public_key._4_4_,(int)server_public_key),
                                  CONCAT44(server_public_key_len._4_4_,
                                           (uint32_t)server_public_key_len));
      if (iVar7 == 0) {
        iVar8 = BN_num_bits((BIGNUM *)exchange_state->k);
        iVar7 = iVar8 + 0xe;
        if (-1 < iVar8 + 7) {
          iVar7 = iVar8 + 7;
        }
        exchange_state->k_value_len = (long)((iVar7 >> 3) + 5);
        uVar9 = BN_num_bits((BIGNUM *)exchange_state->k);
        if ((uVar9 & 7) != 0) {
          exchange_state->k_value_len = exchange_state->k_value_len - 1;
        }
        puVar16 = (uchar *)(*session->alloc)(exchange_state->k_value_len,&session->abstract);
        lVar22 = local_84;
        exchange_state->k_value = puVar16;
        if (puVar16 != (uchar *)0x0) {
          _libssh2_htonu32(puVar16,(int)exchange_state->k_value_len - 4);
          uVar9 = BN_num_bits((BIGNUM *)exchange_state->k);
          if ((uVar9 & 7) == 0) {
            exchange_state->k_value[4] = '\0';
            iVar7 = BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 5);
            if (0 < iVar7) goto LAB_00111edc;
            pcVar20 = "Can\'t write exchange_state->e";
          }
          else {
            iVar7 = BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + 4);
            if (0 < iVar7) {
LAB_00111edc:
              value = (uint32_t)public_key_len;
              if (lVar22 == LIBSSH2_EC_CURVE_NISTP521) {
                iVar8 = _libssh2_sha512_init(&ctx);
                iVar7 = -1;
                if (iVar8 != 0) {
                  exchange_state->exchange_hash = &ctx;
                  puVar17 = (session->local).banner;
                  puVar16 = exchange_state->h_sig_comp;
                  if (puVar17 == (uchar *)0x0) {
                    _libssh2_htonu32(puVar16,0x1a);
                    uVar9 = _libssh2_sha512_update(&ctx,puVar16,4);
                    pcVar20 = "SSH-2.0-libssh2_1.11.2_DEV";
                    sVar23 = 0x1a;
                  }
                  else {
                    sVar18 = strlen((char *)puVar17);
                    _libssh2_htonu32(puVar16,(int)sVar18 - 2);
                    uVar9 = _libssh2_sha512_update(&ctx,puVar16,4);
                    pcVar20 = (char *)(session->local).banner;
                    sVar18 = strlen(pcVar20);
                    sVar23 = sVar18 - 2;
                  }
                  uVar11 = _libssh2_sha512_update(&ctx,pcVar20,sVar23);
                  local_70._0_4_ = uVar11 & uVar9 & 1;
                  sVar18 = strlen((char *)(session->remote).banner);
                  _libssh2_htonu32(puVar16,(uint32_t)sVar18);
                  uVar9 = _libssh2_sha512_update(&ctx,puVar16,4);
                  puVar17 = (session->remote).banner;
                  sVar18 = strlen((char *)puVar17);
                  uVar11 = _libssh2_sha512_update(&ctx,puVar17,sVar18);
                  _libssh2_htonu32(puVar16,(uint32_t)(session->local).kexinit_len);
                  uVar12 = _libssh2_sha512_update(&ctx,puVar16,4);
                  uVar13 = _libssh2_sha512_update
                                     (&ctx,(session->local).kexinit,(session->local).kexinit_len);
                  local_70 = (uchar *)CONCAT44(local_70._4_4_,
                                               uVar13 & uVar12 & uVar11 & uVar9 & (uint)local_70);
                  _libssh2_htonu32(puVar16,(uint32_t)(session->remote).kexinit_len);
                  uVar9 = _libssh2_sha512_update(&ctx,puVar16,4);
                  uVar11 = _libssh2_sha512_update
                                     (&ctx,(session->remote).kexinit,(session->remote).kexinit_len);
                  _libssh2_htonu32(puVar16,session->server_hostkey_len);
                  uVar12 = _libssh2_sha512_update(&ctx,puVar16,4);
                  uVar13 = _libssh2_sha512_update
                                     (&ctx,session->server_hostkey,
                                      (ulong)session->server_hostkey_len);
                  _libssh2_htonu32(puVar16,value);
                  uVar14 = _libssh2_sha512_update(&ctx,puVar16,4);
                  uVar14 = uVar14 & uVar13 & uVar12 & uVar11 & uVar9 & (uint)local_70;
                  uVar9 = _libssh2_sha512_update(&ctx,public_key,public_key_len);
                  _libssh2_htonu32(puVar16,(uint32_t)server_public_key_len);
                  uVar11 = _libssh2_sha512_update(&ctx,puVar16,4);
                  uVar12 = _libssh2_sha512_update
                                     (&ctx,(void *)CONCAT44(server_public_key._4_4_,
                                                            (int)server_public_key),
                                      CONCAT44(server_public_key_len._4_4_,
                                               (uint32_t)server_public_key_len));
                  uVar13 = _libssh2_sha512_update
                                     (&ctx,exchange_state->k_value,exchange_state->k_value_len);
                  if ((uVar12 & uVar11 & uVar9 & uVar14 & uVar13) == 0) {
LAB_0011274f:
                    iVar7 = -1;
                  }
                  else {
                    iVar8 = _libssh2_sha512_final(&ctx,puVar16);
                    iVar7 = -1;
                    if (iVar8 != 0) {
                      pLVar19 = session->hostkey;
                      puVar16 = *local_38;
                      sVar23 = *local_40;
                      sVar25 = 0x40;
LAB_001124fb:
                      puVar17 = exchange_state->h_sig_comp;
LAB_0011273f:
                      iVar7 = (*pLVar19->sig_verify)(session,puVar16,sVar23,puVar17,sVar25,local_80)
                      ;
                      iVar7 = -(uint)(iVar7 != 0);
                    }
                  }
                }
              }
              else if (lVar22 == LIBSSH2_EC_CURVE_NISTP384) {
                iVar8 = _libssh2_sha384_init(&ctx);
                iVar7 = -1;
                if (iVar8 != 0) {
                  exchange_state->exchange_hash = &ctx;
                  puVar17 = (session->local).banner;
                  puVar16 = exchange_state->h_sig_comp;
                  if (puVar17 == (uchar *)0x0) {
                    _libssh2_htonu32(puVar16,0x1a);
                    uVar9 = _libssh2_sha384_update(&ctx,puVar16,4);
                    pcVar20 = "SSH-2.0-libssh2_1.11.2_DEV";
                    sVar23 = 0x1a;
                  }
                  else {
                    sVar18 = strlen((char *)puVar17);
                    _libssh2_htonu32(puVar16,(int)sVar18 - 2);
                    uVar9 = _libssh2_sha384_update(&ctx,puVar16,4);
                    pcVar20 = (char *)(session->local).banner;
                    sVar18 = strlen(pcVar20);
                    sVar23 = sVar18 - 2;
                  }
                  uVar11 = _libssh2_sha384_update(&ctx,pcVar20,sVar23);
                  local_70._0_4_ = uVar11 & uVar9 & 1;
                  sVar18 = strlen((char *)(session->remote).banner);
                  _libssh2_htonu32(puVar16,(uint32_t)sVar18);
                  uVar9 = _libssh2_sha384_update(&ctx,puVar16,4);
                  puVar17 = (session->remote).banner;
                  sVar18 = strlen((char *)puVar17);
                  uVar11 = _libssh2_sha384_update(&ctx,puVar17,sVar18);
                  _libssh2_htonu32(puVar16,(uint32_t)(session->local).kexinit_len);
                  uVar12 = _libssh2_sha384_update(&ctx,puVar16,4);
                  uVar13 = _libssh2_sha384_update
                                     (&ctx,(session->local).kexinit,(session->local).kexinit_len);
                  local_70 = (uchar *)CONCAT44(local_70._4_4_,
                                               uVar13 & uVar12 & uVar11 & uVar9 & (uint)local_70);
                  _libssh2_htonu32(puVar16,(uint32_t)(session->remote).kexinit_len);
                  uVar9 = _libssh2_sha384_update(&ctx,puVar16,4);
                  uVar11 = _libssh2_sha384_update
                                     (&ctx,(session->remote).kexinit,(session->remote).kexinit_len);
                  _libssh2_htonu32(puVar16,session->server_hostkey_len);
                  uVar12 = _libssh2_sha384_update(&ctx,puVar16,4);
                  uVar13 = _libssh2_sha384_update
                                     (&ctx,session->server_hostkey,
                                      (ulong)session->server_hostkey_len);
                  _libssh2_htonu32(puVar16,value);
                  uVar14 = _libssh2_sha384_update(&ctx,puVar16,4);
                  uVar14 = uVar14 & uVar13 & uVar12 & uVar11 & uVar9 & (uint)local_70;
                  uVar9 = _libssh2_sha384_update(&ctx,public_key,public_key_len);
                  _libssh2_htonu32(puVar16,(uint32_t)server_public_key_len);
                  uVar11 = _libssh2_sha384_update(&ctx,puVar16,4);
                  uVar12 = _libssh2_sha384_update
                                     (&ctx,(void *)CONCAT44(server_public_key._4_4_,
                                                            (int)server_public_key),
                                      CONCAT44(server_public_key_len._4_4_,
                                               (uint32_t)server_public_key_len));
                  uVar13 = _libssh2_sha384_update
                                     (&ctx,exchange_state->k_value,exchange_state->k_value_len);
                  if ((uVar12 & uVar11 & uVar9 & uVar14 & uVar13) == 0) goto LAB_0011274f;
                  iVar8 = _libssh2_sha384_final(&ctx,puVar16);
                  iVar7 = -1;
                  if (iVar8 != 0) {
                    pLVar19 = session->hostkey;
                    puVar16 = *local_38;
                    sVar23 = *local_40;
                    sVar25 = 0x30;
                    goto LAB_001124fb;
                  }
                }
              }
              else {
                iVar7 = 0;
                if (lVar22 == LIBSSH2_EC_CURVE_NISTP256) {
                  iVar8 = _libssh2_sha256_init(&ctx);
                  iVar7 = -1;
                  if (iVar8 != 0) {
                    exchange_state->exchange_hash = &ctx;
                    puVar16 = (session->local).banner;
                    puVar17 = exchange_state->h_sig_comp;
                    local_70 = puVar17;
                    if (puVar16 == (uchar *)0x0) {
                      _libssh2_htonu32(puVar17,0x1a);
                      uVar9 = _libssh2_sha256_update(&ctx,puVar17,4);
                      pcVar20 = "SSH-2.0-libssh2_1.11.2_DEV";
                      sVar23 = 0x1a;
                    }
                    else {
                      sVar18 = strlen((char *)puVar16);
                      puVar16 = local_70;
                      _libssh2_htonu32(local_70,(int)sVar18 - 2);
                      uVar9 = _libssh2_sha256_update(&ctx,puVar16,4);
                      pcVar20 = (char *)(session->local).banner;
                      sVar18 = strlen(pcVar20);
                      sVar23 = sVar18 - 2;
                    }
                    uVar11 = _libssh2_sha256_update(&ctx,pcVar20,sVar23);
                    local_5c = uVar11 & uVar9 & 1;
                    sVar18 = strlen((char *)(session->remote).banner);
                    puVar17 = local_70;
                    _libssh2_htonu32(local_70,(uint32_t)sVar18);
                    uVar9 = _libssh2_sha256_update(&ctx,puVar17,4);
                    puVar16 = (session->remote).banner;
                    sVar18 = strlen((char *)puVar16);
                    uVar11 = _libssh2_sha256_update(&ctx,puVar16,sVar18);
                    _libssh2_htonu32(puVar17,(uint32_t)(session->local).kexinit_len);
                    uVar12 = _libssh2_sha256_update(&ctx,puVar17,4);
                    uVar13 = _libssh2_sha256_update
                                       (&ctx,(session->local).kexinit,(session->local).kexinit_len);
                    local_5c = uVar13 & uVar12 & uVar11 & uVar9 & local_5c;
                    _libssh2_htonu32(puVar17,(uint32_t)(session->remote).kexinit_len);
                    uVar9 = _libssh2_sha256_update(&ctx,puVar17,4);
                    uVar11 = _libssh2_sha256_update
                                       (&ctx,(session->remote).kexinit,(session->remote).kexinit_len
                                       );
                    _libssh2_htonu32(puVar17,session->server_hostkey_len);
                    uVar12 = _libssh2_sha256_update(&ctx,puVar17,4);
                    uVar13 = _libssh2_sha256_update
                                       (&ctx,session->server_hostkey,
                                        (ulong)session->server_hostkey_len);
                    _libssh2_htonu32(puVar17,value);
                    uVar14 = _libssh2_sha256_update(&ctx,puVar17,4);
                    uVar14 = uVar14 & uVar13 & uVar12 & uVar11 & uVar9 & local_5c;
                    uVar9 = _libssh2_sha256_update(&ctx,public_key,public_key_len);
                    _libssh2_htonu32(puVar17,(uint32_t)server_public_key_len);
                    uVar11 = _libssh2_sha256_update(&ctx,puVar17,4);
                    uVar12 = _libssh2_sha256_update
                                       (&ctx,(void *)CONCAT44(server_public_key._4_4_,
                                                              (int)server_public_key),
                                        CONCAT44(server_public_key_len._4_4_,
                                                 (uint32_t)server_public_key_len));
                    uVar13 = _libssh2_sha256_update
                                       (&ctx,exchange_state->k_value,exchange_state->k_value_len);
                    if ((uVar12 & uVar11 & uVar9 & uVar14 & uVar13) == 0) goto LAB_0011274f;
                    iVar8 = _libssh2_sha256_final(&ctx,local_70);
                    iVar7 = -1;
                    if (iVar8 != 0) {
                      pLVar19 = session->hostkey;
                      puVar16 = *local_38;
                      sVar23 = *local_40;
                      sVar25 = 0x20;
                      puVar17 = local_70;
                      goto LAB_0011273f;
                    }
                  }
                }
              }
              if (iVar7 == 0) {
                exchange_state->c = '\x15';
                exchange_state->state = libssh2_NB_state_sent;
                bVar6 = true;
                iVar7 = 0;
                goto LAB_0011046d;
              }
              pcVar20 = "Unable to verify hostkey signature ECDH";
              iVar7 = -0xb;
              goto LAB_0011276b;
            }
            pcVar20 = "Can\'t write exchange_state->k";
          }
          iVar7 = -0x29;
          goto LAB_00110462;
        }
        pcVar20 = "Unable to allocate buffer for ECDH K";
        iVar7 = -6;
LAB_0011276b:
        iVar7 = _libssh2_error(session,iVar7,pcVar20);
        bVar6 = false;
      }
      else {
        iVar7 = _libssh2_error(session,-5,"Unable to create ECDH shared secret");
        bVar6 = false;
      }
    }
    else {
      pcVar20 = "Unable to allocate memory for a copy of the host ECDH key";
      iVar7 = -6;
LAB_00110462:
      iVar7 = _libssh2_error(session,iVar7,pcVar20);
      bVar6 = false;
    }
LAB_0011046d:
    iVar8 = iVar7;
    if (!bVar6) goto LAB_0011053a;
  }
  if (exchange_state->state == libssh2_NB_state_sent) {
    iVar8 = _libssh2_transport_send(session,&exchange_state->c,1,(uchar *)0x0,0);
    if (iVar8 == -0x25) {
      return -0x25;
    }
    if (iVar8 == 0) {
      exchange_state->state = libssh2_NB_state_sent2;
      goto LAB_001104b1;
    }
    pcVar20 = "Unable to send NEWKEYS message ECDH";
LAB_0011052a:
    iVar8 = _libssh2_error(session,iVar8,pcVar20);
    goto LAB_0011053a;
  }
LAB_001104b1:
  iVar8 = iVar7;
  if (exchange_state->state != libssh2_NB_state_sent2) goto LAB_0011053a;
  iVar8 = _libssh2_packet_require
                    (session,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,0,(uchar *)0x0,0,
                     &exchange_state->req_state);
  if (iVar8 == -0x25) {
    return -0x25;
  }
  if (iVar8 != 0) {
    pcVar20 = "Timed out waiting for NEWKEYS ECDH";
    goto LAB_0011052a;
  }
  *(byte *)&session->state = (byte)session->state | 4;
  (*session->free)(exchange_state->tmp,&session->abstract);
  if (session->session_id == (uchar *)0x0) {
    if (local_84 == LIBSSH2_EC_CURVE_NISTP256) {
      sVar23 = 0x20;
LAB_00110615:
      puVar16 = (uchar *)(*session->alloc)(sVar23,&session->abstract);
      session->session_id = puVar16;
      if (puVar16 == (uchar *)0x0) {
        pcVar20 = "Unable to allocate buffer for SHA digest";
        iVar7 = -6;
        goto LAB_0011066b;
      }
      memcpy(puVar16,exchange_state->h_sig_comp,sVar23);
      session->session_id_len = (uint32_t)sVar23;
      bVar6 = true;
    }
    else {
      if (local_84 == LIBSSH2_EC_CURVE_NISTP521) {
        sVar23 = 0x40;
        goto LAB_00110615;
      }
      if (local_84 == LIBSSH2_EC_CURVE_NISTP384) {
        sVar23 = 0x30;
        goto LAB_00110615;
      }
      pcVar20 = "Unknown SHA digest for EC curve";
      iVar7 = -5;
LAB_0011066b:
      iVar7 = _libssh2_error(session,iVar7,pcVar20);
      bVar6 = false;
    }
    iVar8 = iVar7;
    if (!bVar6) goto LAB_0011053a;
  }
  p_Var1 = ((session->local).crypt)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->local).crypt_abstract);
  }
  lVar22 = local_84;
  pLVar2 = (session->local).crypt;
  if (pLVar2->init !=
      (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
       *)0x0) {
    server_public_key._0_4_ = 0;
    server_public_key_len._0_4_ = 0;
    if (local_84 == LIBSSH2_EC_CURVE_NISTP256) {
      puVar16 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x20,&session->abstract);
      if (puVar16 == (uchar *)0x0) goto LAB_001109e6;
      if (((session->local).crypt)->iv_len != 0) {
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha256_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha256_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar8 == 0))
          goto LAB_001109eb;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha256_update(&hash,"A",1);
            if (iVar8 == 0) goto LAB_001109eb;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha256_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha256_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_001109eb;
          sVar23 = sVar23 + 0x20;
          lVar22 = local_84;
        } while (sVar23 < (ulong)(long)((session->local).crypt)->iv_len);
      }
    }
    else if (local_84 == LIBSSH2_EC_CURVE_NISTP521) {
      puVar16 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x40,&session->abstract);
      if (puVar16 == (uchar *)0x0) goto LAB_001109e6;
      if (((session->local).crypt)->iv_len != 0) {
        local_80 = (void **)exchange_state->h_sig_comp;
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha512_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha512_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) || (iVar8 = _libssh2_sha512_update(&hash,local_80,0x40), iVar8 == 0))
          goto LAB_001109eb;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha512_update(&hash,"A",1);
            if (iVar8 == 0) goto LAB_001109eb;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha512_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha512_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_001109eb;
          sVar23 = sVar23 + 0x40;
          lVar22 = local_84;
        } while (sVar23 < (ulong)(long)((session->local).crypt)->iv_len);
      }
    }
    else if ((local_84 == LIBSSH2_EC_CURVE_NISTP384) &&
            (puVar16 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x30,&session->abstract),
            puVar16 != (uchar *)0x0)) {
      if (((session->local).crypt)->iv_len != 0) {
        local_80 = (void **)exchange_state->h_sig_comp;
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha384_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha384_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) || (iVar8 = _libssh2_sha384_update(&hash,local_80,0x30), iVar8 == 0))
          goto LAB_001109eb;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha384_update(&hash,"A",1);
            if (iVar8 == 0) goto LAB_001109eb;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha384_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha384_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_001109eb;
          sVar23 = sVar23 + 0x30;
          lVar22 = local_84;
        } while (sVar23 < (ulong)(long)((session->local).crypt)->iv_len);
      }
    }
    else {
LAB_001109e6:
      puVar16 = (uchar *)0x0;
    }
LAB_001109fb:
    if (puVar16 == (uchar *)0x0) {
      iVar7 = -1;
      bVar6 = false;
    }
    else {
      if (lVar22 == LIBSSH2_EC_CURVE_NISTP256) {
        puVar17 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len + 0x20,
                                             &session->abstract);
        if (puVar17 == (uchar *)0x0) goto LAB_00110d55;
        if (((session->local).crypt)->secret_len != 0) {
          local_80 = (void **)exchange_state->h_sig_comp;
          sVar23 = 0;
          do {
            iVar8 = _libssh2_sha256_init(&hash);
            if (((iVar8 == 0) ||
                (iVar8 = _libssh2_sha256_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar8 == 0)) || (iVar8 = _libssh2_sha256_update(&hash,local_80,0x20), iVar8 == 0))
            goto LAB_00110d4c;
            uVar21 = sVar23;
            puVar24 = puVar17;
            if (sVar23 == 0) {
              iVar8 = _libssh2_sha256_update(&hash,"C",1);
              if (iVar8 == 0) goto LAB_00110d4c;
              uVar21 = (ulong)session->session_id_len;
              puVar24 = session->session_id;
            }
            iVar8 = _libssh2_sha256_update(&hash,puVar24,uVar21);
            if ((iVar8 == 0) || (iVar8 = _libssh2_sha256_final(&hash,puVar17 + sVar23), iVar8 == 0))
            goto LAB_00110d4c;
            sVar23 = sVar23 + 0x20;
          } while (sVar23 < (ulong)(long)((session->local).crypt)->secret_len);
        }
      }
      else if (lVar22 == LIBSSH2_EC_CURVE_NISTP521) {
        puVar17 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len + 0x40,
                                             &session->abstract);
        if (puVar17 == (uchar *)0x0) goto LAB_00110d55;
        if (((session->local).crypt)->secret_len != 0) {
          local_80 = (void **)exchange_state->h_sig_comp;
          sVar23 = 0;
          do {
            iVar8 = _libssh2_sha512_init(&hash);
            if (((iVar8 == 0) ||
                (iVar8 = _libssh2_sha512_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar8 == 0)) || (iVar8 = _libssh2_sha512_update(&hash,local_80,0x40), iVar8 == 0))
            goto LAB_00110d4c;
            uVar21 = sVar23;
            puVar24 = puVar17;
            if (sVar23 == 0) {
              iVar8 = _libssh2_sha512_update(&hash,"C",1);
              if (iVar8 == 0) goto LAB_00110d4c;
              uVar21 = (ulong)session->session_id_len;
              puVar24 = session->session_id;
            }
            iVar8 = _libssh2_sha512_update(&hash,puVar24,uVar21);
            if ((iVar8 == 0) || (iVar8 = _libssh2_sha512_final(&hash,puVar17 + sVar23), iVar8 == 0))
            goto LAB_00110d4c;
            sVar23 = sVar23 + 0x40;
          } while (sVar23 < (ulong)(long)((session->local).crypt)->secret_len);
        }
      }
      else if ((lVar22 == LIBSSH2_EC_CURVE_NISTP384) &&
              (puVar17 = (uchar *)(*session->alloc)((long)((session->local).crypt)->secret_len +
                                                    0x30,&session->abstract),
              puVar17 != (uchar *)0x0)) {
        if (((session->local).crypt)->secret_len != 0) {
          local_80 = (void **)exchange_state->h_sig_comp;
          sVar23 = 0;
          do {
            iVar8 = _libssh2_sha384_init(&hash);
            if (((iVar8 == 0) ||
                (iVar8 = _libssh2_sha384_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar8 == 0)) || (iVar8 = _libssh2_sha384_update(&hash,local_80,0x30), iVar8 == 0))
            goto LAB_00110d4c;
            uVar21 = sVar23;
            puVar24 = puVar17;
            if (sVar23 == 0) {
              iVar8 = _libssh2_sha384_update(&hash,"C",1);
              if (iVar8 == 0) goto LAB_00110d4c;
              uVar21 = (ulong)session->session_id_len;
              puVar24 = session->session_id;
            }
            iVar8 = _libssh2_sha384_update(&hash,puVar24,uVar21);
            if ((iVar8 == 0) || (iVar8 = _libssh2_sha384_final(&hash,puVar17 + sVar23), iVar8 == 0))
            goto LAB_00110d4c;
            sVar23 = sVar23 + 0x30;
          } while (sVar23 < (ulong)(long)((session->local).crypt)->secret_len);
        }
      }
      else {
LAB_00110d55:
        puVar17 = (uchar *)0x0;
      }
      if (puVar17 == (uchar *)0x0) {
        bVar6 = false;
        iVar7 = -5;
      }
      else {
        pLVar2 = (session->local).crypt;
        iVar8 = (*pLVar2->init)(session,pLVar2,puVar16,(int *)&server_public_key,puVar17,
                                (int *)&server_public_key_len,1,&(session->local).crypt_abstract);
        if (iVar8 == 0) {
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar16,(long)((session->local).crypt)->iv_len);
            (*session->free)(puVar16,&session->abstract);
          }
          if ((uint32_t)server_public_key_len == 0) {
            bVar6 = true;
            goto LAB_00110dfc;
          }
          explicit_bzero(puVar17,(long)((session->local).crypt)->secret_len);
          bVar6 = true;
          puVar16 = puVar17;
        }
        else {
          (*session->free)(puVar16,&session->abstract);
          bVar6 = false;
          puVar16 = puVar17;
          iVar7 = -5;
        }
      }
      (*session->free)(puVar16,&session->abstract);
    }
LAB_00110dfc:
    iVar8 = iVar7;
    if (!bVar6) goto LAB_0011053a;
  }
  p_Var1 = ((session->remote).crypt)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->remote).crypt_abstract);
  }
  lVar22 = local_84;
  pLVar2 = (session->remote).crypt;
  if (pLVar2->init !=
      (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
       *)0x0) {
    server_public_key._0_4_ = 0;
    server_public_key_len._0_4_ = 0;
    if (local_84 == LIBSSH2_EC_CURVE_NISTP256) {
      puVar16 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x20,&session->abstract);
      if (puVar16 == (uchar *)0x0) goto LAB_00111171;
      if (((session->remote).crypt)->iv_len != 0) {
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha256_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha256_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar8 == 0))
          goto LAB_00111176;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha256_update(&hash,"B",1);
            if (iVar8 == 0) goto LAB_00111176;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha256_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha256_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_00111176;
          sVar23 = sVar23 + 0x20;
          lVar22 = local_84;
        } while (sVar23 < (ulong)(long)((session->remote).crypt)->iv_len);
      }
    }
    else if (local_84 == LIBSSH2_EC_CURVE_NISTP521) {
      puVar16 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x40,&session->abstract);
      if (puVar16 == (uchar *)0x0) goto LAB_00111171;
      if (((session->remote).crypt)->iv_len != 0) {
        local_80 = (void **)exchange_state->h_sig_comp;
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha512_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha512_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) || (iVar8 = _libssh2_sha512_update(&hash,local_80,0x40), iVar8 == 0))
          goto LAB_00111176;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha512_update(&hash,"B",1);
            if (iVar8 == 0) goto LAB_00111176;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha512_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha512_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_00111176;
          sVar23 = sVar23 + 0x40;
          lVar22 = local_84;
        } while (sVar23 < (ulong)(long)((session->remote).crypt)->iv_len);
      }
    }
    else if ((local_84 == LIBSSH2_EC_CURVE_NISTP384) &&
            (puVar16 = (uchar *)(*session->alloc)((long)pLVar2->iv_len + 0x30,&session->abstract),
            puVar16 != (uchar *)0x0)) {
      if (((session->remote).crypt)->iv_len != 0) {
        local_80 = (void **)exchange_state->h_sig_comp;
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha384_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha384_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) || (iVar8 = _libssh2_sha384_update(&hash,local_80,0x30), iVar8 == 0))
          goto LAB_00111176;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha384_update(&hash,"B",1);
            if (iVar8 == 0) goto LAB_00111176;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha384_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha384_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_00111176;
          sVar23 = sVar23 + 0x30;
          lVar22 = local_84;
        } while (sVar23 < (ulong)(long)((session->remote).crypt)->iv_len);
      }
    }
    else {
LAB_00111171:
      puVar16 = (uchar *)0x0;
    }
LAB_00111186:
    if (puVar16 == (uchar *)0x0) {
      iVar7 = -5;
      bVar6 = false;
    }
    else {
      if (lVar22 == LIBSSH2_EC_CURVE_NISTP256) {
        puVar17 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len + 0x20,
                                             &session->abstract);
        if (puVar17 == (uchar *)0x0) goto LAB_00111593;
        if (((session->remote).crypt)->secret_len != 0) {
          local_80 = (void **)exchange_state->h_sig_comp;
          sVar23 = 0;
          do {
            iVar8 = _libssh2_sha256_init(&hash);
            if (((iVar8 == 0) ||
                (iVar8 = _libssh2_sha256_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar8 == 0)) || (iVar8 = _libssh2_sha256_update(&hash,local_80,0x20), iVar8 == 0))
            goto LAB_0011158a;
            uVar21 = sVar23;
            puVar24 = puVar17;
            if (sVar23 == 0) {
              iVar8 = _libssh2_sha256_update(&hash,"D",1);
              if (iVar8 == 0) goto LAB_0011158a;
              uVar21 = (ulong)session->session_id_len;
              puVar24 = session->session_id;
            }
            iVar8 = _libssh2_sha256_update(&hash,puVar24,uVar21);
            if ((iVar8 == 0) || (iVar8 = _libssh2_sha256_final(&hash,puVar17 + sVar23), iVar8 == 0))
            goto LAB_0011158a;
            sVar23 = sVar23 + 0x20;
          } while (sVar23 < (ulong)(long)((session->remote).crypt)->secret_len);
        }
      }
      else if (lVar22 == LIBSSH2_EC_CURVE_NISTP521) {
        puVar17 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len + 0x40,
                                             &session->abstract);
        if (puVar17 == (uchar *)0x0) goto LAB_00111593;
        if (((session->remote).crypt)->secret_len != 0) {
          local_80 = (void **)exchange_state->h_sig_comp;
          sVar23 = 0;
          do {
            iVar8 = _libssh2_sha512_init(&hash);
            if (((iVar8 == 0) ||
                (iVar8 = _libssh2_sha512_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar8 == 0)) || (iVar8 = _libssh2_sha512_update(&hash,local_80,0x40), iVar8 == 0))
            goto LAB_0011158a;
            uVar21 = sVar23;
            puVar24 = puVar17;
            if (sVar23 == 0) {
              iVar8 = _libssh2_sha512_update(&hash,"D",1);
              if (iVar8 == 0) goto LAB_0011158a;
              uVar21 = (ulong)session->session_id_len;
              puVar24 = session->session_id;
            }
            iVar8 = _libssh2_sha512_update(&hash,puVar24,uVar21);
            if ((iVar8 == 0) || (iVar8 = _libssh2_sha512_final(&hash,puVar17 + sVar23), iVar8 == 0))
            goto LAB_0011158a;
            sVar23 = sVar23 + 0x40;
          } while (sVar23 < (ulong)(long)((session->remote).crypt)->secret_len);
        }
      }
      else if ((lVar22 == LIBSSH2_EC_CURVE_NISTP384) &&
              (puVar17 = (uchar *)(*session->alloc)((long)((session->remote).crypt)->secret_len +
                                                    0x30,&session->abstract),
              puVar17 != (uchar *)0x0)) {
        if (((session->remote).crypt)->secret_len != 0) {
          local_80 = (void **)exchange_state->h_sig_comp;
          sVar23 = 0;
          do {
            iVar8 = _libssh2_sha384_init(&hash);
            if (((iVar8 == 0) ||
                (iVar8 = _libssh2_sha384_update
                                   (&hash,exchange_state->k_value,exchange_state->k_value_len),
                iVar8 == 0)) || (iVar8 = _libssh2_sha384_update(&hash,local_80,0x30), iVar8 == 0))
            goto LAB_0011158a;
            uVar21 = sVar23;
            puVar24 = puVar17;
            if (sVar23 == 0) {
              iVar8 = _libssh2_sha384_update(&hash,"D",1);
              if (iVar8 == 0) goto LAB_0011158a;
              uVar21 = (ulong)session->session_id_len;
              puVar24 = session->session_id;
            }
            iVar8 = _libssh2_sha384_update(&hash,puVar24,uVar21);
            if ((iVar8 == 0) || (iVar8 = _libssh2_sha384_final(&hash,puVar17 + sVar23), iVar8 == 0))
            goto LAB_0011158a;
            sVar23 = sVar23 + 0x30;
          } while (sVar23 < (ulong)(long)((session->remote).crypt)->secret_len);
        }
      }
      else {
LAB_00111593:
        puVar17 = (uchar *)0x0;
      }
      if (puVar17 == (uchar *)0x0) {
        bVar6 = false;
        iVar7 = -5;
      }
      else {
        pLVar2 = (session->remote).crypt;
        iVar8 = (*pLVar2->init)(session,pLVar2,puVar16,(int *)&server_public_key,puVar17,
                                (int *)&server_public_key_len,0,&(session->remote).crypt_abstract);
        if (iVar8 == 0) {
          if ((int)server_public_key != 0) {
            explicit_bzero(puVar16,(long)((session->remote).crypt)->iv_len);
            (*session->free)(puVar16,&session->abstract);
          }
          if ((uint32_t)server_public_key_len == 0) {
            bVar6 = true;
            goto LAB_0011163a;
          }
          explicit_bzero(puVar17,(long)((session->remote).crypt)->secret_len);
          bVar6 = true;
          puVar16 = puVar17;
        }
        else {
          (*session->free)(puVar16,&session->abstract);
          bVar6 = false;
          puVar16 = puVar17;
          iVar7 = -5;
        }
      }
      (*session->free)(puVar16,&session->abstract);
    }
LAB_0011163a:
    iVar8 = iVar7;
    if (!bVar6) goto LAB_0011053a;
  }
  p_Var1 = ((session->local).mac)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->local).mac_abstract);
  }
  p_Var3 = (session->local).mac;
  if (p_Var3->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
    server_public_key._0_4_ = 0;
    if (local_84 == LIBSSH2_EC_CURVE_NISTP521) {
      puVar16 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x40,&session->abstract);
      if (puVar16 == (uchar *)0x0) goto LAB_0011199a;
      if (((session->local).mac)->key_len != 0) {
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha512_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha512_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40), iVar8 == 0))
          goto LAB_00111991;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha512_update(&hash,"E",1);
            if (iVar8 == 0) goto LAB_00111991;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha512_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha512_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_00111991;
          sVar23 = sVar23 + 0x40;
        } while (sVar23 < (ulong)(long)((session->local).mac)->key_len);
      }
    }
    else if (local_84 == LIBSSH2_EC_CURVE_NISTP384) {
      puVar16 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x30,&session->abstract);
      if (puVar16 == (uchar *)0x0) goto LAB_0011199a;
      if (((session->local).mac)->key_len != 0) {
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha384_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha384_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30), iVar8 == 0))
          goto LAB_00111991;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha384_update(&hash,"E",1);
            if (iVar8 == 0) goto LAB_00111991;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha384_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha384_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_00111991;
          sVar23 = sVar23 + 0x30;
        } while (sVar23 < (ulong)(long)((session->local).mac)->key_len);
      }
    }
    else if ((local_84 == LIBSSH2_EC_CURVE_NISTP256) &&
            (puVar16 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x20,&session->abstract),
            puVar16 != (uchar *)0x0)) {
      if (((session->local).mac)->key_len != 0) {
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha256_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha256_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar8 == 0))
          goto LAB_00111991;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha256_update(&hash,"E",1);
            if (iVar8 == 0) goto LAB_00111991;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha256_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha256_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_00111991;
          sVar23 = sVar23 + 0x20;
        } while (sVar23 < (ulong)(long)((session->local).mac)->key_len);
      }
    }
    else {
LAB_0011199a:
      puVar16 = (uchar *)0x0;
    }
    if (puVar16 == (uchar *)0x0) {
      iVar7 = -5;
    }
    else {
      (*((session->local).mac)->init)
                (session,puVar16,(int *)&server_public_key,&(session->local).mac_abstract);
      if ((int)server_public_key != 0) {
        explicit_bzero(puVar16,(long)((session->local).mac)->key_len);
        (*session->free)(puVar16,&session->abstract);
      }
    }
    iVar8 = iVar7;
    if (puVar16 == (uchar *)0x0) goto LAB_0011053a;
  }
  p_Var1 = ((session->remote).mac)->dtor;
  if (p_Var1 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
    (*p_Var1)(session,&(session->remote).mac_abstract);
  }
  p_Var3 = (session->remote).mac;
  if (p_Var3->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
    server_public_key._0_4_ = 0;
    if (local_84 == LIBSSH2_EC_CURVE_NISTP521) {
      puVar16 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x40,&session->abstract);
      if (puVar16 == (uchar *)0x0) goto LAB_00111d51;
      if (((session->remote).mac)->key_len != 0) {
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha512_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha512_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha512_update(&hash,exchange_state->h_sig_comp,0x40), iVar8 == 0))
          goto LAB_00111d48;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha512_update(&hash,"F",1);
            if (iVar8 == 0) goto LAB_00111d48;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha512_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha512_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_00111d48;
          sVar23 = sVar23 + 0x40;
        } while (sVar23 < (ulong)(long)((session->remote).mac)->key_len);
      }
    }
    else if (local_84 == LIBSSH2_EC_CURVE_NISTP384) {
      puVar16 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x30,&session->abstract);
      if (puVar16 == (uchar *)0x0) goto LAB_00111d51;
      if (((session->remote).mac)->key_len != 0) {
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha384_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha384_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha384_update(&hash,exchange_state->h_sig_comp,0x30), iVar8 == 0))
          goto LAB_00111d48;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha384_update(&hash,"F",1);
            if (iVar8 == 0) goto LAB_00111d48;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha384_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha384_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_00111d48;
          sVar23 = sVar23 + 0x30;
        } while (sVar23 < (ulong)(long)((session->remote).mac)->key_len);
      }
    }
    else if ((local_84 == LIBSSH2_EC_CURVE_NISTP256) &&
            (puVar16 = (uchar *)(*session->alloc)((long)p_Var3->key_len + 0x20,&session->abstract),
            puVar16 != (uchar *)0x0)) {
      if (((session->remote).mac)->key_len != 0) {
        sVar23 = 0;
        do {
          iVar8 = _libssh2_sha256_init(&hash);
          if (((iVar8 == 0) ||
              (iVar8 = _libssh2_sha256_update
                                 (&hash,exchange_state->k_value,exchange_state->k_value_len),
              iVar8 == 0)) ||
             (iVar8 = _libssh2_sha256_update(&hash,exchange_state->h_sig_comp,0x20), iVar8 == 0))
          goto LAB_00111d48;
          uVar21 = sVar23;
          puVar17 = puVar16;
          if (sVar23 == 0) {
            iVar8 = _libssh2_sha256_update(&hash,"F",1);
            if (iVar8 == 0) goto LAB_00111d48;
            uVar21 = (ulong)session->session_id_len;
            puVar17 = session->session_id;
          }
          iVar8 = _libssh2_sha256_update(&hash,puVar17,uVar21);
          if ((iVar8 == 0) || (iVar8 = _libssh2_sha256_final(&hash,puVar16 + sVar23), iVar8 == 0))
          goto LAB_00111d48;
          sVar23 = sVar23 + 0x20;
        } while (sVar23 < (ulong)(long)((session->remote).mac)->key_len);
      }
    }
    else {
LAB_00111d51:
      puVar16 = (uchar *)0x0;
    }
    if (puVar16 == (uchar *)0x0) {
      iVar7 = -5;
    }
    else {
      (*((session->remote).mac)->init)
                (session,puVar16,(int *)&server_public_key,&(session->remote).mac_abstract);
      if ((int)server_public_key != 0) {
        explicit_bzero(puVar16,(long)((session->remote).mac)->key_len);
        (*session->free)(puVar16,&session->abstract);
      }
    }
    iVar8 = iVar7;
    if (puVar16 == (uchar *)0x0) goto LAB_0011053a;
  }
  pLVar4 = (session->local).comp;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->dtor, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    (*p_Var5)(session,1,&(session->local).comp_abstract);
  }
  pLVar4 = (session->local).comp;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->init, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    iVar10 = (*p_Var5)(session,1,&(session->local).comp_abstract);
    iVar8 = -5;
    if (iVar10 != 0) goto LAB_0011053a;
  }
  pLVar4 = (session->remote).comp;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->dtor, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    (*p_Var5)(session,0,&(session->remote).comp_abstract);
  }
  pLVar4 = (session->remote).comp;
  iVar8 = iVar7;
  if ((pLVar4 != (LIBSSH2_COMP_METHOD *)0x0) &&
     (p_Var5 = pLVar4->init, p_Var5 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0)) {
    iVar10 = (*p_Var5)(session,0,&(session->remote).comp_abstract);
    iVar8 = -5;
    if (iVar10 == 0) {
      iVar8 = iVar7;
    }
  }
LAB_0011053a:
  ecdh_exchange_state_cleanup(session,exchange_state);
  return iVar8;
LAB_001109eb:
  (*session->free)(puVar16,&session->abstract);
  puVar16 = (uchar *)0x0;
  lVar22 = local_84;
  goto LAB_001109fb;
LAB_00110d4c:
  (*session->free)(puVar17,&session->abstract);
  goto LAB_00110d55;
LAB_00111176:
  (*session->free)(puVar16,&session->abstract);
  puVar16 = (uchar *)0x0;
  lVar22 = local_84;
  goto LAB_00111186;
LAB_0011158a:
  (*session->free)(puVar17,&session->abstract);
  goto LAB_00111593;
LAB_00111991:
  (*session->free)(puVar16,&session->abstract);
  goto LAB_0011199a;
LAB_00111d48:
  (*session->free)(puVar16,&session->abstract);
  goto LAB_00111d51;
}

Assistant:

static int ecdh_sha2_nistp(LIBSSH2_SESSION *session, libssh2_curve_type type,
                           unsigned char *data, size_t data_len,
                           unsigned char *public_key,
                           size_t public_key_len, _libssh2_ec_key *private_key,
                           kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;

    if(data_len < 5) {
        ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                             "Host key data is too short");
        return ret;
    }

    if(exchange_state->state == libssh2_NB_state_idle) {

        /* Setup initial values */
        exchange_state->k = _libssh2_bn_init();

        exchange_state->state = libssh2_NB_state_created;
    }

    if(exchange_state->state == libssh2_NB_state_created) {
        /* parse INIT reply data */

        /* host key K_S */
        unsigned char *server_public_key;
        size_t server_public_key_len;
        struct string_buf buf;

        buf.data = data;
        buf.len = data_len;
        buf.dataptr = buf.data;
        buf.dataptr++; /* Advance past packet type */

        if(_libssh2_copy_string(session, &buf, &(session->server_hostkey),
                                &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host ECDH key");
            goto clean_exit;
        }

        session->server_hostkey_len = (uint32_t)server_public_key_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if(libssh2_md5_init(&fingerprint_ctx) &&
               libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                  session->server_hostkey_len) &&
               libssh2_md5_final(fingerprint_ctx,
                                 session->server_hostkey_md5)) {
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if(libssh2_sha1_init(&fingerprint_ctx) &&
               libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len) &&
               libssh2_sha1_final(fingerprint_ctx,
                                  session->server_hostkey_sha1)) {
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;
            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint));
        }
#endif /* LIBSSH2DEBUG */

        /* SHA256 */
        {
            libssh2_sha256_ctx fingerprint_ctx;

            if(libssh2_sha256_init(&fingerprint_ctx) &&
               libssh2_sha256_update(fingerprint_ctx, session->server_hostkey,
                                     session->server_hostkey_len) &&
               libssh2_sha256_final(fingerprint_ctx,
                                    session->server_hostkey_sha256)) {
                session->server_hostkey_sha256_valid = TRUE;
            }
            else {
                session->server_hostkey_sha256_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char *base64Fingerprint = NULL;
            _libssh2_base64_encode(session,
                                   (const char *)
                                   session->server_hostkey_sha256,
                                   SHA256_DIGEST_LENGTH, &base64Fingerprint);
            if(base64Fingerprint) {
                _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                               "Server's SHA256 Fingerprint: %s",
                               base64Fingerprint));
                LIBSSH2_FREE(session, base64Fingerprint);
            }
        }
#endif /* LIBSSH2DEBUG */

        if(session->hostkey->init(session, session->server_hostkey,
                                  session->server_hostkey_len,
                                  &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer "
                                 "ECDH");
            goto clean_exit;
        }

        /* server public key Q_S */
        if(_libssh2_get_string(&buf, &server_public_key,
                               &server_public_key_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length ECDH");
            goto clean_exit;
        }

        /* server signature */
        if(_libssh2_get_string(&buf, &exchange_state->h_sig,
           &(exchange_state->h_sig_len))) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unexpected ECDH server sig length");
            goto clean_exit;
        }

        /* Compute the shared secret K */
        rc = _libssh2_ecdh_gen_k(&exchange_state->k, private_key,
                                 server_public_key, server_public_key_len);
        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                 "Unable to create ECDH shared secret");
            goto clean_exit;
        }

        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
        LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if(!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for ECDH K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         (uint32_t)(exchange_state->k_value_len - 4));
        if(_libssh2_bn_bits(exchange_state->k) % 8) {
            if(_libssh2_bn_to_bin(exchange_state->k,
                                  exchange_state->k_value + 4)) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                                     "Can't write exchange_state->k");
                goto clean_exit;
            }
        }
        else {
            exchange_state->k_value[4] = 0;
            if(_libssh2_bn_to_bin(exchange_state->k,
                                  exchange_state->k_value + 5)) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_OUT_OF_BOUNDARY,
                                     "Can't write exchange_state->e");
                goto clean_exit;
            }
        }

        /* verify hash */

        switch(type) {
            case LIBSSH2_EC_CURVE_NISTP256:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(256);
                break;
            case LIBSSH2_EC_CURVE_NISTP384:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(384);
                break;
            case LIBSSH2_EC_CURVE_NISTP521:
                LIBSSH2_KEX_METHOD_EC_SHA_HASH_CREATE_VERIFY(512);
                break;
        }

        if(rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature "
                                 "ECDH");
            goto clean_exit;
        }

        exchange_state->c = SSH_MSG_NEWKEYS;
        exchange_state->state = libssh2_NB_state_sent;
    }

    if(exchange_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send NEWKEYS message ECDH");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if(exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timed out waiting for NEWKEYS ECDH");
            goto clean_exit;
        }

        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Received NEWKEYS message ECDH"));

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if(!session->session_id) {

            size_t digest_length = 0;

            if(type == LIBSSH2_EC_CURVE_NISTP256)
                digest_length = SHA256_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP384)
                digest_length = SHA384_DIGEST_LENGTH;
            else if(type == LIBSSH2_EC_CURVE_NISTP521)
                digest_length = SHA512_DIGEST_LENGTH;
            else{
                ret = _libssh2_error(session, LIBSSH2_ERROR_KEX_FAILURE,
                                     "Unknown SHA digest for EC curve");
                goto clean_exit;

            }
            session->session_id = LIBSSH2_ALLOC(session, digest_length);
            if(!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for "
                                     "SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   digest_length);
             session->session_id_len = (uint32_t)digest_length;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "session_id calculated"));
        }

        /* Cleanup any existing cipher */
        if(session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if(session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->local.crypt->
                                                 iv_len, "A");
            if(!iv) {
                ret = -1;
                goto clean_exit;
            }

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->local.crypt->
                                                 secret_len, "C");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated"));

        if(session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if(session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(iv,
                                                 session->remote.crypt->
                                                 iv_len, "B");

            if(!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(secret,
                                                 session->remote.crypt->
                                                 secret_len, "D");

            if(!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if(session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                    LIBSSH2_FREE(session, iv);
                    LIBSSH2_FREE(session, secret);
                    ret = LIBSSH2_ERROR_KEX_FAILURE;
                    goto clean_exit;
                }

            if(free_iv) {
                _libssh2_explicit_zero(iv, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if(free_secret) {
                _libssh2_explicit_zero(secret,
                                       session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated"));

        if(session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if(session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->local.mac->
                                                 key_len, "E");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated"));

        if(session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if(session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_EC_SHA_VALUE_HASH(key,
                                                 session->remote.mac->
                                                 key_len, "F");

            if(!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if(free_key) {
                _libssh2_explicit_zero(key, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated"));

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if(session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if(session->local.comp && session->local.comp->init) {
            if(session->local.comp->init(session, 1,
                                         &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized"));

        if(session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if(session->remote.comp && session->remote.comp->init) {
            if(session->remote.comp->init(session, 0,
                                          &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized"));
    }

clean_exit:
    ecdh_exchange_state_cleanup(session, exchange_state);

    return ret;
}